

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::GetProperty
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  long *plVar1;
  Type TVar2;
  ScriptContext *this_00;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  Var pvVar6;
  RecyclableObject *pRVar7;
  int index;
  Type *pTVar8;
  uint32 local_3c;
  Var *ppvStack_38;
  uint32 indexVal;
  
  iVar5 = this->propertyCount;
  bVar3 = 0 < iVar5;
  value = value;
  if (0 < iVar5) {
    pTVar8 = this->descriptors;
    index = 0;
    ppvStack_38 = value;
    if ((this->descriptors[0].Id.ptr)->pid != propertyId) {
      index = 0;
      do {
        if (iVar5 + -1 == index) {
          bVar3 = false;
          goto LAB_00e4f61d;
        }
        plVar1 = (long *)(pTVar8 + 1);
        pTVar8 = pTVar8 + 1;
        index = index + 1;
      } while (*(int *)(*plVar1 + 8) != propertyId);
      bVar3 = index < iVar5;
    }
    if (((pTVar8->field_1).Attributes & 8) == 0) {
      pvVar6 = DynamicObject::GetSlot(instance,index);
      *ppvStack_38 = pvVar6;
      iVar5 = 1;
      value = ppvStack_38;
      if (info != (PropertyValueInfo *)0x0) {
        TVar2 = (pTVar8->field_1).Attributes;
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = (PropertyIndex)index;
        info->m_attributes = TVar2;
        info->flags = InlineCacheNoFlags;
      }
    }
    else {
      pRVar7 = ScriptContext::GetMissingPropertyResult(requestContext);
      *ppvStack_38 = pRVar7;
      iVar5 = 0;
      value = ppvStack_38;
    }
  }
LAB_00e4f61d:
  if (!bVar3) {
    this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
    bVar3 = DynamicObject::HasObjectArray(instance);
    if ((bVar3) &&
       (BVar4 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_3c), BVar4 != 0)) {
      iVar5 = DynamicTypeHandler::GetItem
                        (&this->super_DynamicTypeHandler,instance,originalInstance,local_3c,value,
                         this_00);
    }
    else {
      pRVar7 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar7;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    *value = requestContext->GetMissingPropertyResult();
                    return false;
                }
                *value = instance->GetSlot(i);
                PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(i), descriptors[i].Attributes);
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::GetItem(instance, originalInstance, indexVal, value, scriptContext);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }